

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock_tests.cpp
# Opt level: O2

void __thiscall sock_tests::wait::test_method(wait *this)

{
  long lVar1;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  undefined4 local_a4;
  ssize_t local_a0;
  char *local_98;
  char *local_90;
  undefined **local_88;
  undefined1 local_80;
  undefined1 *local_78;
  char *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  thread waiter;
  Sock sock1;
  Sock sock0;
  int s [2];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CreateSocketPair(s);
  Sock::Sock(&sock0,s[0]);
  Sock::Sock(&sock1,s[1]);
  waiter._M_id._M_thread = (id)0;
  local_88 = (undefined **)operator_new(0x10);
  *local_88 = (undefined *)&PTR___State_0114ca98;
  local_88[1] = (undefined *)&sock0;
  std::thread::_M_start_thread(&waiter,&local_88,0);
  if (local_88 != (undefined **)0x0) {
    (**(code **)(*local_88 + 8))();
  }
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_50 = "";
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x8a;
  file.m_begin = (iterator)&local_58;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_68,msg);
  local_80 = 0;
  local_88 = &PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = "";
  local_98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_90 = "";
  local_a0 = Sock::Send(&sock1,"a",1,0);
  local_a4 = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_88,&local_98,0x8a,2,2,&local_a0,"sock1.Send(\"a\", 1, 0)",&local_a4,"1");
  std::thread::join();
  std::thread::~thread(&waiter);
  Sock::~Sock(&sock1);
  Sock::~Sock(&sock0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(wait)
{
    int s[2];
    CreateSocketPair(s);

    Sock sock0(s[0]);
    Sock sock1(s[1]);

    std::thread waiter([&sock0]() { (void)sock0.Wait(24h, Sock::RECV); });

    BOOST_REQUIRE_EQUAL(sock1.Send("a", 1, 0), 1);

    waiter.join();
}